

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLAttributeBuffer::setData_helper<int>
          (GLAttributeBuffer *this,vector<int,_std::allocator<int>_> *data)

{
  long lVar1;
  PFNGLBUFFERDATAPROC p_Var2;
  PFNGLBUFFERSUBDATAPROC p_Var3;
  bool bVar4;
  GLenum GVar5;
  unsigned_long *puVar6;
  size_type sVar7;
  const_reference pvVar8;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  GLAttributeBuffer *in_RDI;
  uint64_t newSize;
  bool in_stack_00000067;
  unsigned_long local_20;
  size_type local_18;
  vector<int,_std::allocator<int>_> *local_10;
  
  local_10 = in_RSI;
  bind(in_RDI,(int)in_RSI,in_RDX,in_ECX);
  bVar4 = AttributeBuffer::isSet(&in_RDI->super_AttributeBuffer);
  if ((!bVar4) ||
     (sVar7 = geometrycentral::surface::std::vector<int,_std::allocator<int>_>::size(local_10),
     (in_RDI->super_AttributeBuffer).bufferSize < sVar7)) {
    (in_RDI->super_AttributeBuffer).setFlag = true;
    local_18 = geometrycentral::surface::std::vector<int,_std::allocator<int>_>::size(local_10);
    local_20 = (in_RDI->super_AttributeBuffer).bufferSize << 1;
    puVar6 = std::max<unsigned_long>(&local_18,&local_20);
    p_Var2 = glad_glBufferData;
    local_18 = *puVar6;
    GVar5 = getTarget(in_RDI);
    (*p_Var2)(GVar5,local_18 << 2,(void *)0x0,0x88e4);
    (in_RDI->super_AttributeBuffer).bufferSize = local_18;
  }
  sVar7 = geometrycentral::surface::std::vector<int,_std::allocator<int>_>::size(local_10);
  (in_RDI->super_AttributeBuffer).dataSize = sVar7;
  p_Var3 = glad_glBufferSubData;
  GVar5 = getTarget(in_RDI);
  lVar1 = (in_RDI->super_AttributeBuffer).dataSize;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_10,0);
  (*p_Var3)(GVar5,0,lVar1 << 2,pvVar8);
  checkGLError(in_stack_00000067);
  return;
}

Assistant:

void GLAttributeBuffer::setData_helper(const std::vector<T>& data) {
  bind();

  // allocate if needed
  if (!isSet() || data.size() > bufferSize) {
    setFlag = true;
    uint64_t newSize = data.size();
    newSize = std::max(newSize, 2 * bufferSize); // if we're expanding, at-least double
    glBufferData(getTarget(), newSize * sizeof(T), NULL, GL_STATIC_DRAW);
    bufferSize = newSize;
  }

  // do the actual copy
  dataSize = data.size();
  glBufferSubData(getTarget(), 0, dataSize * sizeof(T), &data[0]);

  checkGLError();
}